

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# monitor.c
# Opt level: O1

monitor * monitor_list_get_workspace_monitor(monitor_list *monitor_list,workspace *workspace)

{
  undefined8 *puVar1;
  workspace *pwVar2;
  monitor *pmVar3;
  bool bVar4;
  
  if (workspace != (workspace *)0x0) {
    pmVar3 = (monitor *)monitor_list->monitors;
    for (puVar1 = *(undefined8 **)pmVar3; puVar1 != (undefined8 *)0x0;
        puVar1 = (undefined8 *)*puVar1) {
      pwVar2 = ((monitor *)puVar1[2])->workspace;
      if (pwVar2 == (workspace *)0x0) {
        bVar4 = false;
      }
      else {
        bVar4 = pwVar2->index == workspace->index;
        if (bVar4) {
          pmVar3 = (monitor *)puVar1[2];
        }
      }
      if (bVar4) {
        return pmVar3;
      }
    }
  }
  return (monitor *)0x0;
}

Assistant:

struct monitor *monitor_list_get_workspace_monitor(const struct monitor_list *monitor_list,
                                                   const struct workspace *workspace)
{
        if (workspace == NULL) {
                return NULL;
        }

        LIST_FOR_EACH(monitor_list->monitors, monitor_item)
        {
                struct monitor *monitor = (struct monitor *)monitor_item->data;

                if (monitor->workspace == NULL) {
                        continue;
                }

                if (monitor->workspace->index == workspace->index) {
                        return monitor;
                }
        }

        return NULL;
}